

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgb_to_gl(djg_buffer *buffer,void *data,int *offset)

{
  void *__dest;
  void *ptr;
  int *piStack_28;
  GLint buf;
  int *offset_local;
  void *data_local;
  djg_buffer *buffer_local;
  
  ptr._4_4_ = 0;
  piStack_28 = offset;
  offset_local = (int *)data;
  data_local = buffer;
  (*glad_glGetIntegerv)(0x8894,(GLint *)((long)&ptr + 4));
  if (*(int *)((long)data_local + 4) <
      *(int *)((long)data_local + 0xc) + *(int *)((long)data_local + 8)) {
    *(undefined4 *)((long)data_local + 0xc) = 0;
    fprintf(_stdout,"djg_info: buffer orphaned\n");
    fflush(_stdout);
  }
  (*glad_glBindBuffer)(0x8892,*data_local);
  __dest = (*glad_glMapBufferRange)
                     (0x8892,(long)*(int *)((long)data_local + 0xc),
                      (long)*(int *)((long)data_local + 8),0x22);
  if (__dest == (void *)0x0) {
    fprintf(_stdout,"djg_error: Buffer mapping failed\n");
    fflush(_stdout);
    buffer_local._7_1_ = false;
  }
  else {
    memcpy(__dest,offset_local,(long)*(int *)((long)data_local + 8));
    (*glad_glUnmapBuffer)(0x8892);
    (*glad_glBindBuffer)(0x8892,ptr._4_4_);
    if (piStack_28 != (int *)0x0) {
      *piStack_28 = *(int *)((long)data_local + 0xc);
    }
    *(int *)((long)data_local + 0xc) =
         *(int *)((long)data_local + 8) + *(int *)((long)data_local + 0xc);
    buffer_local._7_1_ = true;
  }
  return buffer_local._7_1_;
}

Assistant:

DJGDEF bool djgb_to_gl(djg_buffer *buffer, const void *data, int *offset)
{
    GLint buf = 0;
    void *ptr = NULL;

    // save GL state
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &buf);

    // orphaning
    if (buffer->offset + buffer->size > buffer->capacity) {
        buffer->offset = 0;
        DJG_LOG("djg_info: buffer orphaned\n");
    }

    // stream data asynchronously
    glBindBuffer(GL_ARRAY_BUFFER, buffer->gl);
    ptr = glMapBufferRange(
        GL_ARRAY_BUFFER,
        buffer->offset,
        buffer->size,
        GL_MAP_WRITE_BIT | GL_MAP_UNSYNCHRONIZED_BIT
    );
    if (!ptr) {
        DJG_LOG("djg_error: Buffer mapping failed\n");

        return false;
    }
    memcpy(ptr, data, buffer->size);
    glUnmapBuffer(GL_ARRAY_BUFFER);
    glBindBuffer(GL_ARRAY_BUFFER, buf);

    // update buffer offset
    if (offset) (*offset) = buffer->offset;
    buffer->offset+= buffer->size;

    return true;
}